

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Encode.cpp
# Opt level: O3

void idx2::EncodeBrick(idx2_file *Idx2,params *P,encode_data *E,bool IncrementLevel)

{
  grid *SbGrid;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  byte *pbVar6;
  ulong uVar7;
  ulong uVar8;
  char cVar9;
  int iVar10;
  u64 uVar11;
  bool IncrementLevel_00;
  int iVar12;
  undefined7 in_register_00000009;
  brick_volume *TransformDetails;
  char *pcVar13;
  int iVar14;
  long lVar15;
  char cVar16;
  uint uVar17;
  uint uVar18;
  i64 *this;
  int iVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  v3i Brick3;
  extent eVar23;
  extent ToGrid;
  u64 PKey;
  grid SbGridNonExt;
  iterator PbIt;
  iterator BIt;
  extent local_120;
  undefined1 local_110 [8];
  brick_volume local_108;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_c0;
  v3<int> *local_b8;
  v3i *local_b0;
  long local_a8;
  int *local_a0;
  long local_98;
  int *local_90;
  array<idx2::subband> *local_88;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_80;
  volume *local_78;
  long local_70;
  long local_68;
  extent local_60;
  iterator local_50;
  
  cVar9 = (P->Meta).Field[0x2c] + (char)E;
  (P->Meta).Field[0x2c] = cVar9;
  if ('\x0f' < cVar9) {
    pcVar13 = 
    "t &idx2::stack_array<unsigned long, 16>::operator[](int) const [t = unsigned long, N = 16]";
LAB_0018d9ec:
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,pcVar13);
  }
  lVar22 = (long)cVar9;
  this = &(P->NasaMask).Buffer.Bytes;
  local_108.Vol.Buffer.Data =
       (byte *)(*(long *)((P->Meta).Field + lVar22 * 8 + 0x34) * 0x10 + lVar22);
  local_c0 = (anon_union_8_4_6ba14846_for_v2<int>_1)local_108.Vol.Buffer.Data;
  Lookup<unsigned_long,idx2::brick_volume>
            (&local_50,(idx2 *)this,(hash_table<unsigned_long,_idx2::brick_volume> *)(local_110 + 8)
             ,(unsigned_long *)CONCAT71(in_register_00000009,IncrementLevel));
  uVar11 = ((local_50.Val)->ExtentLocal).Dims;
  local_108.Vol.Buffer.Data =
       (byte *)((long)(uVar11 << 0x16) >> 0xb & 0xffffffff00000000U |
               (ulong)(uint)((long)(uVar11 << 0x2b) >> 0x2b));
  local_108.Vol.Buffer.Bytes =
       CONCAT44(local_108.Vol.Buffer.Bytes._4_4_,(int)((long)(uVar11 * 2) >> 0x2b));
  ExtrapolateCdf53((v3i *)(local_110 + 8),Idx2->TransformOrder,&(local_50.Val)->Vol);
  uVar17 = (int)cVar9 + 1;
  local_b0 = &Idx2->BrickDimsExt3;
  local_88 = &Idx2->Subbands;
  TransformDetails = (brick_volume *)&Idx2->TransformDetails;
  ForwardCdf53(local_b0,(int)(P->Meta).Field[0x2c],local_88,(transform_info *)TransformDetails,
               &(local_50.Val)->Vol,uVar17 == (int)Idx2->NLevels);
  if ((Idx2->Subbands).Size != 0) {
    local_90 = &P->BitPlanesPerFile + lVar22 * 3;
    local_98 = (long)(int)uVar17;
    local_a0 = &P->BitPlanesPerFile + local_98 * 3;
    local_a8 = (long)(char)uVar17;
    local_b8 = (Idx2->NBricks3).Arr + lVar22;
    lVar22 = 0;
    cVar16 = '\0';
    do {
      pbVar6 = (local_88->Buffer).Data;
      SbGrid = (grid *)(pbVar6 + lVar22 * 0x40);
      lVar22 = *(long *)(pbVar6 + lVar22 * 0x40 + 8);
      iVar19 = (int)((lVar22 << 0x16) >> 0x2b);
      if ((cVar16 == '\0') && ((int)uVar17 < (int)Idx2->NLevels)) {
        if (cVar9 == '\x0f') {
          pcVar13 = 
          "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
          ;
          goto LAB_0018d9ec;
        }
        uVar21 = (int)((lVar22 << 0x2b) >> 0x2b) - (uint)(1 < (lVar22 << 0x2b) >> 0x2b);
        uVar20 = iVar19 - (uint)(1 < iVar19);
        iVar19 = *local_90;
        iVar1 = local_90[1];
        iVar2 = (int)((extent *)(local_90 + 2))->From;
        uVar18 = (int)(lVar22 * 2 >> 0x2b) - (uint)(1 < lVar22 * 2 >> 0x2b);
        uVar7 = (long)iVar19 / (long)(Idx2->GroupBrick3).field_0.field_0.X;
        uVar8 = (long)iVar2 / (long)(Idx2->GroupBrick3).field_0.field_0.Z;
        *(ulong *)local_a0 =
             (long)iVar1 / (long)(Idx2->GroupBrick3).field_0.field_0.Y << 0x20 | uVar7 & 0xffffffff;
        *(int *)&((extent *)(local_a0 + 2))->From = (int)uVar8;
        Brick3.field_0._0_8_ = uVar8 & 0xffffffff;
        Brick3.field_0.field_0.Z = iVar2;
        uVar11 = GetLinearBrick((idx2 *)Idx2,(idx2_file *)(ulong)uVar17,(int)uVar7,Brick3);
        *(u64 *)((P->Meta).Field + local_98 * 8 + 0x34) = uVar11;
        local_110 = (undefined1  [8])(uVar11 * 0x10 + local_a8);
        Lookup<unsigned_long,idx2::brick_volume>
                  ((iterator *)&local_80.field_0,(idx2 *)this,
                   (hash_table<unsigned_long,_idx2::brick_volume> *)local_110,(unsigned_long *)P);
        if (*(char *)(*(long *)(local_70 + 0x10) + local_68) != '\x02') {
          if (Mallocator()::Instance == '\0') {
            EncodeBrick();
          }
          local_108.Vol.Buffer.Data = (byte *)0x0;
          local_108.Vol.Buffer.Bytes = 0;
          local_108.Vol.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
          local_108.Vol.Dims = 0;
          local_108.Vol.Type = 10;
          local_108.ExtentLocal.From = 0;
          local_108.ExtentLocal.Dims = 0;
          local_108.NChildrenDecoded = '\0';
          local_108.NChildrenMax = '\0';
          local_108.Significant = false;
          local_108.DoneDecoding = false;
          Resize((volume *)(local_110 + 8),local_b0,float64,(allocator *)(P->NasaMask).Buffer.Data);
          lVar15 = (long)(local_108.Vol.Dims * 2) >> 0x2b;
          lVar22 = (long)(local_108.Vol.Dims << 0x16) >> 0x2b;
          if (lVar22 != 0 && (lVar15 != 0 && (local_108.Vol.Dims & 0x1fffff) != 0)) {
            memset(local_108.Vol.Buffer.Data,0,
                   lVar15 * lVar22 * ((long)(local_108.Vol.Dims << 0x2b) >> 0x2b) * 8);
          }
          uVar3 = (Idx2->GroupBrick3).field_0.field_0.X;
          uVar4 = (Idx2->GroupBrick3).field_0.field_0.Y;
          uVar5 = (Idx2->GroupBrick3).field_0.field_0.Z;
          local_120.From =
               (ulong)(iVar2 - iVar2 % (int)uVar5 & 0x1fffff) << 0x2a |
               (ulong)(iVar1 - iVar1 % (int)uVar4 & 0x1fffff) << 0x15 |
               (ulong)(iVar19 - iVar19 % (int)uVar3 & 0x1fffff);
          local_120.Dims =
               (ulong)(uVar5 & 0x1fffff) << 0x2a |
               ((ulong)uVar4 & 0x1fffff) << 0x15 | (ulong)uVar3 & 0x1fffff;
          local_60.From = 0;
          local_60.Dims =
               (ulong)((local_b8->field_0).field_0.Z & 0x1fffff) << 0x2a |
               ((ulong)(uint)(local_b8->field_0).field_0.Y & 0x1fffff) << 0x15 |
               (ulong)(uint)(local_b8->field_0).field_0.X & 0x1fffff;
          eVar23 = Crop<idx2::extent,idx2::extent>(&local_120,&local_60);
          iVar14 = ((int)eVar23.Dims << 0xb) >> 0xb;
          iVar12 = (int)((long)(eVar23.Dims * 2) >> 0x2b);
          iVar10 = (int)((long)(eVar23.Dims << 0x16) >> 0x2b);
          local_108.NChildrenMax = (char)iVar12 * (char)iVar14 * (char)iVar10;
          local_108.ExtentLocal.Dims =
               (ulong)(uVar18 * iVar12 & 0x1fffff) << 0x2a |
               (ulong)(iVar10 * uVar20 & 0x1fffff) << 0x15 | (ulong)(iVar14 * uVar21 & 0x1fffff);
          local_108.ExtentLocal.From = 0;
          Insert<unsigned_long,idx2::brick_volume>
                    ((iterator *)&local_80.field_0,(unsigned_long *)local_110,
                     (brick_volume *)(local_110 + 8));
        }
        local_108.Vol.Buffer.Data = (byte *)(SbGrid->super_extent).From;
        local_108.Vol.Buffer.Alloc = (allocator *)SbGrid->Strd;
        local_120.Dims =
             (ulong)(uVar18 & 0x1fffff) << 0x2a |
             (ulong)(uVar20 & 0x1fffff) << 0x15 | (ulong)(uVar21 & 0x1fffff);
        local_120.From =
             (ulong)((iVar2 % (Idx2->GroupBrick3).field_0.field_0.Z) * uVar18 & 0x1fffff) << 0x2a |
             (ulong)((iVar1 % (Idx2->GroupBrick3).field_0.field_0.Y) * uVar20 & 0x1fffff) << 0x15 |
             (ulong)((iVar19 % (Idx2->GroupBrick3).field_0.field_0.X) * uVar21 & 0x1fffff);
        local_108.Vol.Buffer.Bytes = local_120.Dims;
        CopyGridExtent<double,double>
                  ((grid *)(local_110 + 8),&(local_50.Val)->Vol,&local_120,local_78);
        IncrementLevel_00 = (bool)(*(char *)&local_78[1].Buffer.Alloc + '\x01');
        *(bool *)&local_78[1].Buffer.Alloc = IncrementLevel_00;
        if (IncrementLevel_00 == (bool)*(undefined1 *)((long)&local_78[1].Buffer.Alloc + 1)) {
          EncodeBrick(Idx2,P,(encode_data *)0x1,IncrementLevel_00);
        }
      }
      (P->Meta).Field[0x2d] = cVar16;
      TransformDetails = local_50.Val;
      EncodeSubband(Idx2,(encode_data *)P,SbGrid,&(local_50.Val)->Vol);
      cVar16 = cVar16 + '\x01';
      lVar22 = (long)cVar16;
    } while ((Idx2->Subbands).Size != lVar22);
  }
  Dealloc(&(local_50.Val)->Vol);
  local_80 = local_c0;
  Delete<unsigned_long,idx2::brick_volume>
            ((iterator *)(local_110 + 8),(idx2 *)this,
             (hash_table<unsigned_long,_idx2::brick_volume> *)&local_80.field_0,
             (unsigned_long *)TransformDetails);
  pcVar13 = (P->Meta).Field + 0x2c;
  *pcVar13 = *pcVar13 - (char)E;
  return;
}

Assistant:

static void
EncodeBrick(idx2_file* Idx2, const params& P, encode_data* E, bool IncrementLevel = false)
{
  idx2_Assert(Idx2->NLevels <= idx2_file::MaxLevels);

  i8 Level = E->Level += IncrementLevel;

  u64 Brick = E->Brick[Level];
  //printf(
  //  "level %d brick " idx2_PrStrV3i " %" PRIu64 "\n", Iter, idx2_PrV3i(E->Bricks3[Iter]), Brick);
  auto BIt = Lookup(E->BrickPool, GetBrickKey(Level, Brick));
  idx2_Assert(BIt);
  volume& BVol = BIt.Val->Vol;
  idx2_Assert(BVol.Buffer);

  // TODO: we do not need to pre-extrapolate, instead just compute and store the extrapolated values
  ExtrapolateCdf53(Dims(BIt.Val->ExtentLocal), Idx2->TransformOrder, &BVol);

  /* do wavelet transform */
  bool CoarsestLevel = Level + 1 == Idx2->NLevels; // only normalize
  ForwardCdf53(Idx2->BrickDimsExt3, E->Level, Idx2->Subbands, Idx2->TransformDetails, &BVol, CoarsestLevel);

  /* recursively encode the brick, one subband at a time */
  idx2_For (i8, Sb, 0, Size(Idx2->Subbands))
  { // subband loop
    const subband& S = Idx2->Subbands[Sb];
    v3i SbDimsNonExt3 = idx2_NonExtDims(Dims(S.Grid));
    i8 NextLevel = Level + 1;
    if (Sb == 0 && NextLevel < Idx2->NLevels)
    { // need to encode the parent brick
      /* find the parent brick and create it if not found */
      v3i Brick3 = E->Bricks3[Level];
      v3i PBrick3 = (E->Bricks3[NextLevel] = Brick3 / Idx2->GroupBrick3);
      u64 PBrick = (E->Brick[NextLevel] = GetLinearBrick(*Idx2, NextLevel, PBrick3));
      u64 PKey = GetBrickKey(NextLevel, PBrick);
      auto PbIt = Lookup(E->BrickPool, PKey);
      if (!PbIt)
      { // instantiate the parent brick in the hash table
        brick_volume PBrickVol;
        Resize(&PBrickVol.Vol, Idx2->BrickDimsExt3, dtype::float64, E->Alloc);
        Fill(idx2_Range(f64, PBrickVol.Vol), 0.0);
        v3i From3 = (Brick3 / Idx2->GroupBrick3) * Idx2->GroupBrick3;
        v3i NChildren3 =
          Dims(Crop(extent(From3, Idx2->GroupBrick3), extent(Idx2->NBricks3[Level])));
        PBrickVol.NChildrenMax = (i8)Prod(NChildren3);
        PBrickVol.ExtentLocal = extent(NChildren3 * SbDimsNonExt3);
        Insert(&PbIt, PKey, PBrickVol);
      }
      /* copy data to the parent brick and (optionally) encode it */
      v3i LocalBrickPos3 = Brick3 % Idx2->GroupBrick3;
      grid SbGridNonExt = S.Grid;
      SetDims(&SbGridNonExt, SbDimsNonExt3);
      extent ToGrid(LocalBrickPos3 * SbDimsNonExt3, SbDimsNonExt3);
      CopyGridExtent<f64, f64>(SbGridNonExt, BVol, ToGrid, &PbIt.Val->Vol);
      //      Copy(SbGridNonExt, BVol, ToGrid, &PbIt.Val->Vol);
      bool LastChild = ++PbIt.Val->NChildrenDecoded == PbIt.Val->NChildrenMax;
      if (LastChild)
        EncodeBrick(Idx2, P, E, true);
    } // end Sb == 0 && NextIteration < Idx2->NLevels
    E->Subband = Sb;
    EncodeSubband(Idx2, E, S.Grid, &BVol);
  } // end subband loop
  Dealloc(&BVol);
  Delete(&E->BrickPool, GetBrickKey(Level, Brick));
  E->Level -= IncrementLevel;
}